

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O1

void __thiscall
HighsCutPool::HighsCutPool(HighsCutPool *this,HighsInt ncols,HighsInt agelim,HighsInt softlimit)

{
  _Rb_tree_header *p_Var1;
  
  HighsDynamicRowMatrix::HighsDynamicRowMatrix(&this->matrix_,ncols);
  (this->rowintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rowintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rowintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->maxabscoef_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->maxabscoef_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rownormalization_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maxabscoef_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rownormalization_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rownormalization_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hashToCutMap)._M_h._M_buckets = &(this->hashToCutMap)._M_h._M_single_bucket;
  (this->hashToCutMap)._M_h._M_bucket_count = 1;
  (this->hashToCutMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hashToCutMap)._M_h._M_element_count = 0;
  (this->hashToCutMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->propRows)._M_t._M_impl.super__Rb_tree_header;
  (this->propRows)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->propRows)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hashToCutMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hashToCutMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->propagationDomains).
  super__Vector_base<HighsDomain::CutpoolPropagation_*,_std::allocator<HighsDomain::CutpoolPropagation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->propagationDomains).
  super__Vector_base<HighsDomain::CutpoolPropagation_*,_std::allocator<HighsDomain::CutpoolPropagation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->propagationDomains).
  super__Vector_base<HighsDomain::CutpoolPropagation_*,_std::allocator<HighsDomain::CutpoolPropagation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->propRows)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->propRows)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->propRows)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->agelim_ = agelim;
  this->softlimit_ = softlimit;
  this->numLpCuts = 0;
  this->numPropNzs = 0;
  this->numPropRows = 0;
  (this->sortBuffer).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sortBuffer).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sortBuffer).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->ageDistribution,(long)(agelim + 1));
  *(undefined4 *)&this->bestObservedScore = 0;
  *(undefined4 *)((long)&this->bestObservedScore + 4) = 0;
  *(undefined4 *)&this->minScoreFactor = 0xcccccccd;
  *(undefined4 *)((long)&this->minScoreFactor + 4) = 0x3feccccc;
  this->minDensityLim = (double)ncols * 0.1;
  return;
}

Assistant:

HighsCutPool(HighsInt ncols, HighsInt agelim, HighsInt softlimit)
      : matrix_(ncols),
        agelim_(agelim),
        softlimit_(softlimit),
        numLpCuts(0),
        numPropNzs(0),
        numPropRows(0) {
    ageDistribution.resize(agelim_ + 1);
    minScoreFactor = 0.9;
    bestObservedScore = 0.0;
    minDensityLim = 0.1 * ncols;
  }